

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O1

void __thiscall duckdb::CSVSniffer::DetectTypes(CSVSniffer *this)

{
  vector<duckdb::HeaderValue,_true> *this_00;
  undefined1 *puVar1;
  CSVReaderOptions *pCVar2;
  size_type __n;
  ulong uVar3;
  _Head_base<0UL,_duckdb::StringValueScanner_*,_false> _Var4;
  anon_union_16_2_67f50693_for_value *paVar5;
  unsigned_long *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
  *this_02;
  undefined8 uVar7;
  pointer pLVar8;
  pointer pLVar9;
  bool bVar10;
  int iVar11;
  pointer this_03;
  CSVStateMachine *state_machine;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_04;
  pointer pSVar12;
  type candidate_00;
  undefined4 extraout_var;
  DataChunk *data_chunk;
  CSVErrorHandler *pCVar13;
  CSVStateMachine *pCVar14;
  mapped_type *this_05;
  reference this_06;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_07;
  _Base_ptr p_Var15;
  reference vector;
  idx_t iVar16;
  pointer this_08;
  ulong uVar17;
  element_type *this_09;
  size_type __n_00;
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
  candidate;
  vector<duckdb::LogicalType,_true> return_types;
  HeaderValue value;
  unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
  info_sql_types_candidates;
  ulong local_208;
  ulong local_200;
  pointer local_1e8;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::vector<duckdb::LogicalType,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::vector<duckdb::LogicalType,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_1e0;
  unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
  *local_1d8;
  _Base_ptr local_1d0;
  undefined1 local_1c8 [32];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1a8;
  pointer local_188;
  element_type *local_180;
  CSVError local_178;
  undefined1 local_e8 [40];
  CSVStates *local_c0;
  undefined1 auStack_b8 [80];
  _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_1a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_08 = (this->candidates).
            super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_188 = (this->candidates).
              super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (this_08 != local_188) {
    local_208 = this->max_columns_found + 1;
    this_00 = &this->best_header_row;
    local_1e0 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::vector<duckdb::LogicalType,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::vector<duckdb::LogicalType,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 *)&this->best_sql_types_candidates_per_column_idx;
    local_1d0 = &(this->format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_180 = (element_type *)&this->best_format_candidates;
    local_200 = 0xffffffffffffffff;
    do {
      this_03 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                ::operator->(this_08);
      state_machine = BaseScanner::GetStateMachine(&this_03->super_BaseScanner);
      local_e8._0_8_ = auStack_b8;
      local_e8._8_8_ = &DAT_00000001;
      local_e8._16_8_ = (_Hash_node_base *)0x0;
      local_e8._24_8_ = (pointer)0x0;
      local_e8._32_4_ = 1.0;
      local_c0 = (CSVStates *)0x0;
      auStack_b8._0_8_ = (pointer)0x0;
      local_178.error_message._M_dataplus._M_p = (pointer)0x0;
      if (this->max_columns_found != 0) {
        do {
          pCVar2 = state_machine->options;
          this_04 = &::std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_e8,(key_type *)&local_178)->
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                    (this_04,&(pCVar2->auto_type_candidates).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                    );
          local_178.error_message._M_dataplus._M_p = local_178.error_message._M_dataplus._M_p + 1;
        } while (local_178.error_message._M_dataplus._M_p < (pointer)this->max_columns_found);
      }
      pLVar9 = local_1a8.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pLVar8 = local_1a8.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
      this_09 = (element_type *)
                local_1a8.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_1d8 = this_08;
      if (local_1a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_1a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        do {
          LogicalType::~LogicalType((LogicalType *)this_09);
          this_09 = (element_type *)&(this_09->main_mutex).super___mutex_base._M_mutex.__data.__list
          ;
        } while (this_09 != (element_type *)pLVar9);
        local_1a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = pLVar8;
      }
      __n = this->max_columns_found;
      LogicalType::LogicalType((LogicalType *)&local_178,VARCHAR);
      this_02 = local_1d8;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_fill_assign
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_1c8 + 0x20),__n,(value_type *)&local_178);
      LogicalType::~LogicalType((LogicalType *)&local_178);
      unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
      ::operator->(this_02);
      ColumnCountScanner::UpgradeToStringValueScanner((ColumnCountScanner *)local_1c8);
      pSVar12 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                              *)local_1c8);
      candidate_00 = shared_ptr<duckdb::CSVStateMachine,_true>::operator*
                               (&(pSVar12->super_BaseScanner).state_machine);
      SetUserDefinedDateTimeFormat(this,candidate_00);
      pSVar12 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                              *)local_1c8);
      iVar11 = (*(pSVar12->super_BaseScanner)._vptr_BaseScanner[2])(pSVar12);
      data_chunk = StringValueResult::ToChunk((StringValueResult *)CONCAT44(extraout_var,iVar11));
      pSVar12 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                              *)local_1c8);
      pCVar13 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                          (&(pSVar12->super_BaseScanner).error_handler);
      bVar10 = CSVErrorHandler::AnyErrors(pCVar13);
      if (bVar10) {
        pSVar12 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                  ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                                *)local_1c8);
        pCVar13 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                            (&(pSVar12->super_BaseScanner).error_handler);
        bVar10 = CSVErrorHandler::HasError(pCVar13,MAXIMUM_LINE_SIZE);
        if (bVar10) goto LAB_015277b9;
        pSVar12 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                  ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                                *)local_1c8);
        pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                            (&(pSVar12->super_BaseScanner).state_machine);
        if ((pCVar14->options->ignore_errors).value != false) goto LAB_015277b9;
      }
      else {
LAB_015277b9:
        uVar3 = data_chunk->count;
        if ((uVar3 < 2) ||
           (((this->options->dialect_options).header.set_by_user == true &&
            ((this->options->dialect_options).header.value != true)))) {
          iVar16 = 0;
        }
        else {
          iVar16 = 1;
        }
        SniffTypes(this,data_chunk,state_machine,
                   (unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                    *)local_e8,iVar16);
        local_1e8 = (pointer)0x0;
        if ((pointer)local_e8._24_8_ == (pointer)0x0) {
          uVar17 = 0;
        }
        else {
          uVar17 = 0;
          do {
            this_05 = ::std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_e8,(key_type *)&local_1e8);
            this_06 = vector<duckdb::LogicalType,_true>::back(this_05);
            LogicalType::LogicalType((LogicalType *)&local_178,VARCHAR);
            bVar10 = LogicalType::operator==(this_06,(LogicalType *)&local_178);
            LogicalType::~LogicalType((LogicalType *)&local_178);
            uVar17 = uVar17 + bVar10;
            local_1e8 = local_1e8 + 1;
          } while (local_1e8 < (ulong)local_e8._24_8_);
        }
        pSVar12 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                  ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                                *)local_1c8);
        pCVar13 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                            (&(pSVar12->super_BaseScanner).error_handler);
        iVar16 = CSVErrorHandler::GetSize(pCVar13);
        if (((this->best_candidate).
             super_unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
             .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl ==
             (StringValueScanner *)0x0) ||
           (((uVar17 < local_208 &&
             ((((double)CONCAT44(0x45300000,(int)(this->max_columns_found >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)this->max_columns_found) - 4503599627370496.0)) *
              0.7 < ((double)CONCAT44(0x45300000,SUB84(local_e8._24_8_,4)) - 1.9342813113834067e+25)
                    + ((double)CONCAT44(0x43300000,(int)local_e8._24_8_) - 4503599627370496.0))) &&
            (((this->options->ignore_errors).value != true || (iVar16 < local_200)))))) {
          ::std::vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>::clear
                    (&this_00->
                      super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>);
          uVar7 = local_1c8._0_8_;
          local_1c8._0_8_ = (StringValueScanner *)0x0;
          _Var4._M_head_impl =
               (this->best_candidate).
               super_unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
               .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl;
          (this->best_candidate).
          super_unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
          .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl =
               (StringValueScanner *)uVar7;
          if (_Var4._M_head_impl != (StringValueScanner *)0x0) {
            (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseScanner + 8))();
          }
          if ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::vector<duckdb::LogicalType,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::vector<duckdb::LogicalType,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)local_e8 != local_1e0) {
            ::std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::vector<duckdb::LogicalType,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::vector<duckdb::LogicalType,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::vector<duckdb::LogicalType,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::vector<duckdb::LogicalType,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                      (local_1e0,
                       (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)local_e8);
          }
          p_Var15 = (this->format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (p_Var15 != local_1d0) {
            do {
              this_07 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)::std::
                           map<duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>_>
                           ::operator[]((map<duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>_>
                                         *)local_180,(key_type *)(p_Var15 + 1));
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=(this_07,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&p_Var15[1]._M_left);
              p_Var15 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var15);
            } while (p_Var15 != local_1d0);
          }
          local_208 = uVar17;
          local_200 = iVar16;
          if ((uVar3 != 0) &&
             (this->single_row_file = uVar3 == 1,
             (data_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             (data_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start)) {
            __n_00 = 0;
            do {
              vector = vector<duckdb::Vector,_true>::operator[](&data_chunk->data,__n_00);
              paVar5 = (anon_union_16_2_67f50693_for_value *)vector->data;
              FlatVector::VerifyFlatVector(vector);
              puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              this_01 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_01->_M_use_count = this_01->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_01->_M_use_count = this_01->_M_use_count + 1;
                }
              }
              if ((puVar6 == (unsigned_long *)0x0) || ((*puVar6 & 1) != 0)) {
                HeaderValue::HeaderValue((HeaderValue *)&local_178,(string_t)paVar5->pointer);
                ::std::vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>::push_back
                          (&this_00->
                            super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>,
                           (value_type *)&local_178);
                if ((undefined1 *)local_178.error_message._M_string_length !=
                    (undefined1 *)((long)&local_178.error_message.field_2 + 8)) goto LAB_01527ab7;
              }
              else {
                local_178.error_message._M_dataplus._M_p._0_1_ = 1;
                puVar1 = (undefined1 *)((long)&local_178.error_message.field_2 + 8);
                local_178.error_message.field_2._M_allocated_capacity = 0;
                local_178.error_message.field_2._M_local_buf[8] = '\0';
                local_178.error_message._M_string_length = (size_type)puVar1;
                ::std::vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>::
                emplace_back<duckdb::HeaderValue>
                          (&this_00->
                            super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>,
                           (HeaderValue *)&local_178);
                if ((undefined1 *)local_178.error_message._M_string_length != puVar1) {
LAB_01527ab7:
                  operator_delete((void *)local_178.error_message._M_string_length);
                }
              }
              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
              }
              __n_00 = __n_00 + 1;
            } while (__n_00 < (ulong)(((long)(data_chunk->data).
                                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                             .
                                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(data_chunk->data).
                                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                             .
                                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     0x4ec4ec4ec4ec4ec5));
          }
        }
      }
      if ((StringValueScanner *)local_1c8._0_8_ != (StringValueScanner *)0x0) {
        (*((BaseScanner *)local_1c8._0_8_)->_vptr_BaseScanner[1])();
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_e8);
      this_08 = local_1d8 + 1;
    } while (this_08 != local_188);
  }
  if ((this->best_candidate).
      super_unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
      .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl ==
      (StringValueScanner *)0x0) {
    DialectCandidates::DialectCandidates
              ((DialectCandidates *)local_e8,(CSVStateMachineOptions *)this->options);
    pCVar2 = this->options;
    DialectCandidates::Print_abi_cxx11_((string *)local_1c8,(DialectCandidates *)local_e8);
    CSVError::SniffingError
              (&local_178,pCVar2,(string *)local_1c8,this->max_columns_found,&this->set_columns);
    if ((StringValueScanner *)local_1c8._0_8_ != (StringValueScanner *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_);
    }
    pCVar13 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(&this->error_handler);
    CSVErrorHandler::Error(pCVar13,&local_178,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.csv_row._M_dataplus._M_p != &local_178.csv_row.field_2) {
      operator_delete(local_178.csv_row._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.full_error_message._M_dataplus._M_p != &local_178.full_error_message.field_2) {
      operator_delete(local_178.full_error_message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.error_message._M_dataplus._M_p != &local_178.error_message.field_2) {
      operator_delete(local_178.error_message._M_dataplus._M_p);
    }
    ::std::
    _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    ::std::
    _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(auStack_b8 + 0x18));
    if ((pointer)auStack_b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)auStack_b8._0_8_);
    }
    if ((pointer)local_e8._24_8_ != (pointer)0x0) {
      operator_delete((void *)local_e8._24_8_);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_1c8 + 0x20)
            );
  return;
}

Assistant:

void CSVSniffer::DetectTypes() {
	idx_t min_varchar_cols = max_columns_found + 1;
	idx_t min_errors = NumericLimits<idx_t>::Maximum();
	vector<LogicalType> return_types;
	// check which info candidate leads to minimum amount of non-varchar columns...
	for (auto &candidate_cc : candidates) {
		auto &sniffing_state_machine = candidate_cc->GetStateMachine();
		unordered_map<idx_t, vector<LogicalType>> info_sql_types_candidates;
		for (idx_t i = 0; i < max_columns_found; i++) {
			info_sql_types_candidates[i] = sniffing_state_machine.options.auto_type_candidates;
		}
		D_ASSERT(max_columns_found > 0);

		// Set all return_types to VARCHAR, so we can do datatype detection based on VARCHAR values
		return_types.clear();
		return_types.assign(max_columns_found, LogicalType::VARCHAR);

		// Reset candidate for parsing
		auto candidate = candidate_cc->UpgradeToStringValueScanner();
		SetUserDefinedDateTimeFormat(*candidate->state_machine);
		// Parse chunk and read csv with info candidate
		auto &data_chunk = candidate->ParseChunk().ToChunk();
		if (candidate->error_handler->AnyErrors() && !candidate->error_handler->HasError(MAXIMUM_LINE_SIZE) &&
		    !candidate->state_machine->options.ignore_errors.GetValue()) {
			continue;
		}
		idx_t start_idx_detection = 0;
		idx_t chunk_size = data_chunk.size();
		if (chunk_size > 1 &&
		    (!options.dialect_options.header.IsSetByUser() ||
		     (options.dialect_options.header.IsSetByUser() && options.dialect_options.header.GetValue()))) {
			// This means we have more than one row, hence we can use the first row to detect if we have a header
			start_idx_detection = 1;
		}
		// First line where we start our type detection
		SniffTypes(data_chunk, sniffing_state_machine, info_sql_types_candidates, start_idx_detection);

		// Count the number of varchar columns
		idx_t varchar_cols = 0;
		for (idx_t col = 0; col < info_sql_types_candidates.size(); col++) {
			auto &col_type_candidates = info_sql_types_candidates[col];
			// check number of varchar columns
			const auto &col_type = col_type_candidates.back();
			if (col_type == LogicalType::VARCHAR) {
				varchar_cols++;
			}
		}

		// it's good if the dialect creates more non-varchar columns, but only if we sacrifice < 30% of
		// best_num_cols.
		const idx_t number_of_errors = candidate->error_handler->GetSize();
		if (!best_candidate || (varchar_cols<min_varchar_cols &&static_cast<double>(info_sql_types_candidates.size())>(
		                            static_cast<double>(max_columns_found) * 0.7) &&
		                        (!options.ignore_errors.GetValue() || number_of_errors < min_errors))) {
			min_errors = number_of_errors;
			best_header_row.clear();
			// we have a new best_options candidate
			best_candidate = std::move(candidate);
			min_varchar_cols = varchar_cols;
			best_sql_types_candidates_per_column_idx = info_sql_types_candidates;
			for (auto &format_candidate : format_candidates) {
				best_format_candidates[format_candidate.first] = format_candidate.second.format;
			}
			if (chunk_size > 0) {
				single_row_file = chunk_size == 1;
				for (idx_t col_idx = 0; col_idx < data_chunk.ColumnCount(); col_idx++) {
					auto &cur_vector = data_chunk.data[col_idx];
					auto vector_data = FlatVector::GetData<string_t>(cur_vector);
					auto null_mask = FlatVector::Validity(cur_vector);
					if (null_mask.RowIsValid(0)) {
						auto value = HeaderValue(vector_data[0]);
						best_header_row.push_back(value);
					} else {
						best_header_row.push_back({});
					}
				}
			}
		}
	}
	if (!best_candidate) {
		DialectCandidates dialect_candidates(options.dialect_options.state_machine_options);
		auto error = CSVError::SniffingError(options, dialect_candidates.Print(), max_columns_found, set_columns);
		error_handler->Error(error, true);
	}
	// Assert that it's all good at this point.
	D_ASSERT(best_candidate && !best_format_candidates.empty());
}